

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTest.cpp
# Opt level: O3

void __thiscall PathTest::PartsTest(PathTest *this)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  Path p;
  long *local_78 [2];
  long local_68 [2];
  PathTest *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  lVar2 = 0x109200;
  uVar3 = 0;
  local_58 = this;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,*(char **)(lVar2 + -0x20),(allocator<char> *)local_78);
    JetHead::Path::parent();
    iVar1 = std::__cxx11::string::compare((char *)local_78);
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
    if (iVar1 != 0) {
      JetHead::Path::parent();
      TestCase::TestFailedInternal
                (&local_58->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/PathTest.cpp"
                 ,0xac,"parent failed %d \"%s\"",uVar3 & 0xffffffff,local_78[0]);
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
    }
    JetHead::Path::filename_abi_cxx11_();
    iVar1 = std::__cxx11::string::compare((char *)local_78);
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
    if (iVar1 != 0) {
      JetHead::Path::filename_abi_cxx11_();
      TestCase::TestFailedInternal
                (&local_58->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/PathTest.cpp"
                 ,0xae,"filename failed %d \"%s\"",uVar3 & 0xffffffff,local_78[0]);
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
    }
    JetHead::Path::fileBasename_abi_cxx11_();
    iVar1 = std::__cxx11::string::compare((char *)local_78);
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
    if (iVar1 != 0) {
      JetHead::Path::fileBasename_abi_cxx11_();
      TestCase::TestFailedInternal
                (&local_58->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/PathTest.cpp"
                 ,0xb0,"fileBasename failed %d \"%s\"",uVar3 & 0xffffffff,local_78[0]);
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
    }
    JetHead::Path::filenameExtention_abi_cxx11_();
    iVar1 = std::__cxx11::string::compare((char *)local_78);
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
    if (iVar1 != 0) {
      JetHead::Path::filenameExtention_abi_cxx11_();
      TestCase::TestFailedInternal
                (&local_58->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/PathTest.cpp"
                 ,0xb2,"filenameExtention failed %d \"%s\"",uVar3 & 0xffffffff,local_78[0]);
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 0x28;
  } while (uVar3 != 10);
  return;
}

Assistant:

void PathTest::PartsTest()
{
	for ( int i = 0; i < JH_ARRAY_SIZE( partsTestData ); i++ )
	{
		Path p( partsTestData[ i ].path );
		if ( p.parent() != partsTestData[ i ].parent )
			TestFailed( "parent failed %d \"%s\"", i, p.parent().getString().c_str() );
		if ( p.filename() != partsTestData[ i ].filename )
			TestFailed( "filename failed %d \"%s\"", i, p.filename().c_str() );
		if ( p.fileBasename() != partsTestData[ i ].fileBasename )
			TestFailed( "fileBasename failed %d \"%s\"", i, p.fileBasename().c_str() );
		if ( p.filenameExtention() != partsTestData[ i ].filenameExtention )
			TestFailed( "filenameExtention failed %d \"%s\"", i, p.filenameExtention().c_str() );
	}
}